

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_spectrum.cc
# Opt level: O1

void __thiscall
sptk::FilterCoefficientsToSpectrum::FilterCoefficientsToSpectrum
          (FilterCoefficientsToSpectrum *this,int num_numerator_order,int num_denominator_order,
          int fft_length,InputOutputFormats output_format,double epsilon,
          double relative_floor_in_decibels)

{
  this->_vptr_FilterCoefficientsToSpectrum =
       (_func_int **)&PTR__FilterCoefficientsToSpectrum_001158c8;
  this->num_numerator_order_ = num_numerator_order;
  this->num_denominator_order_ = num_denominator_order;
  this->fft_length_ = fft_length;
  RealValuedFastFourierTransform::RealValuedFastFourierTransform
            (&this->fast_fourier_transform_,fft_length);
  SpectrumToSpectrum::SpectrumToSpectrum
            (&this->spectrum_to_spectrum_,this->fft_length_,kPowerSpectrum,output_format,epsilon,
             relative_floor_in_decibels);
  this->is_valid_ = true;
  if ((((this->num_numerator_order_ < 0) || (this->num_denominator_order_ < 0)) ||
      (this->fft_length_ <= this->num_denominator_order_ ||
       this->fft_length_ <= this->num_numerator_order_)) ||
     (((this->fast_fourier_transform_).is_valid_ != true ||
      ((this->spectrum_to_spectrum_).is_valid_ == false)))) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

FilterCoefficientsToSpectrum::FilterCoefficientsToSpectrum(
    int num_numerator_order, int num_denominator_order, int fft_length,
    SpectrumToSpectrum::InputOutputFormats output_format, double epsilon,
    double relative_floor_in_decibels)
    : num_numerator_order_(num_numerator_order),
      num_denominator_order_(num_denominator_order),
      fft_length_(fft_length),
      fast_fourier_transform_(fft_length_),
      spectrum_to_spectrum_(fft_length_, SpectrumToSpectrum::kPowerSpectrum,
                            output_format, epsilon, relative_floor_in_decibels),
      is_valid_(true) {
  if (num_numerator_order_ < 0 || num_denominator_order_ < 0 ||
      fft_length_ <= num_numerator_order_ ||
      fft_length_ <= num_denominator_order_ ||
      !fast_fourier_transform_.IsValid() || !spectrum_to_spectrum_.IsValid()) {
    is_valid_ = false;
  }
}